

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

Signature __thiscall wasm::HeapType::getSignature(HeapType *this)

{
  bool bVar1;
  HeapTypeInfo *pHVar2;
  HeapType *this_local;
  
  bVar1 = isSignature(this);
  if (!bVar1) {
    __assert_fail("isSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                  ,0x395,"Signature wasm::HeapType::getSignature() const");
  }
  pHVar2 = anon_unknown_0::getHeapTypeInfo((HeapType)this->id);
  return (pHVar2->field_9).signature;
}

Assistant:

Signature HeapType::getSignature() const {
  assert(isSignature());
  return getHeapTypeInfo(*this)->signature;
}